

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O2

string * __thiscall
str::join<std::set<LinkedToken,std::less<LinkedToken>,std::allocator<LinkedToken>>>
          (string *__return_storage_ptr__,str *this,string_view delimiter,
          set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *container)

{
  _Rb_tree_node_base *p_Var1;
  ostream *o;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  _Self __tmp_1;
  _Rb_tree_node_base *p_Var3;
  ostringstream stream;
  ostringstream local_1a8 [376];
  
  p_Var2 = *(_Rb_tree_node_base **)(delimiter._M_str + 0x18);
  p_Var3 = (_Rb_tree_node_base *)(delimiter._M_str + 8);
  if (p_Var2 == p_Var3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_1a8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    operator<<((ostream *)local_1a8,(LinkedToken *)(p_Var2 + 1));
    while (p_Var1 != p_Var3) {
      o = std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)delimiter._M_len,(long)this);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      operator<<(o,(LinkedToken *)(p_Var1 + 1));
      p_Var1 = p_Var2;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(std::string_view delimiter, const Container& container) {
        if (std::begin(container) == std::end(container)) {
            return "";
        }

        auto it = std::begin(container);
        std::ostringstream stream;
        stream << *it++;
        while (it != std::end(container)) {
            stream << delimiter << *it++;
        }

        return stream.str();
    }